

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

void __thiscall TCMallocTest_Versions_Test::TestBody(TCMallocTest_Versions_Test *this)

{
  ostream *this_00;
  ostream *poVar1;
  char *pcVar2;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [7];
  ios_base local_158 [264];
  undefined1 local_50 [8];
  string expected_version_string;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  this_00 = (ostream *)(local_1d8 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,"gperftools ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".90",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  local_1d8._0_8_ = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"gperftools 2.16.90","");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_28,"expected_version_string","std::string(\"gperftools 2.16.90\")",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
  if ((ostream *)local_1d8._0_8_ != this_00) {
    operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
  }
  if (local_28[0] != (internal)0x0) {
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    pcVar2 = getenv("GPERFTOOLS_ENSURE_PACKAGE_VERSION");
    if (pcVar2 == (char *)0x0) goto LAB_0010da95;
    TestBody();
  }
  testing::Message::Message((Message *)local_1d8);
  if (gtest_ar._0_8_ == 0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)gtest_ar._0_8_;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)((long)&expected_version_string.field_2 + 8),kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
             ,0x26b,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)((long)&expected_version_string.field_2 + 8),(Message *)local_1d8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)((long)&expected_version_string.field_2 + 8));
  if ((ostream *)local_1d8._0_8_ != (ostream *)0x0) {
    (**(code **)(*(long *)local_1d8._0_8_ + 8))();
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
LAB_0010da95:
  if (local_50 != (undefined1  [8])&expected_version_string._M_string_length) {
    operator_delete((void *)local_50,expected_version_string._M_string_length + 1);
  }
  return;
}

Assistant:

TEST(TCMallocTest, Versions) {
  auto build_version_string = [] (int major, int minor, const char* patch) -> std::string {
    CHECK(patch[0] == 0 || patch[0] == '.'); // patch version needs to start with dot
    std::stringstream ss;
    ss << "gperftools " << major << "." << minor << patch;
    return ss.str();
  };

  // We make sure that TC_VERSION_STRING define matches
  // TC_VERSION_MAJOR, TC_VERSION_MAJOR and TC_VERSION_PATCH (see
  // tcmalloc.h)
  std::string expected_version_string = build_version_string(TC_VERSION_MAJOR, TC_VERSION_MINOR, TC_VERSION_PATCH);
  ASSERT_EQ(expected_version_string, std::string(TC_VERSION_STRING));

  // autoconf's config.h has PACKAGE_VERSION that is taken from configure.ac
#if defined(PACKAGE_VERSION)
  // And we make sure that autoconf's idea of version matches what
  // we've manually put into tcmalloc.h
  ASSERT_EQ(expected_version_string, std::string("gperftools ") + PACKAGE_VERSION);
#else
  // Make sure we're able to exercise line above (we set this
  // environment variable in test runner)
  CHECK_EQ(getenv("GPERFTOOLS_ENSURE_PACKAGE_VERSION"), nullptr);
#endif
}